

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_qsort_template.h
# Opt level: O0

void ON__shortsort_double_decreasing(double *lo,double *hi)

{
  double dVar1;
  double tmp;
  double *max;
  double *p;
  double *hi_local;
  double *lo_local;
  
  for (p = hi; lo < p; p = p + -1) {
    tmp = (double)lo;
    for (max = lo + 1; max <= p; max = max + 1) {
      if (*max < *(double *)tmp) {
        tmp = (double)max;
      }
    }
    dVar1 = *(double *)tmp;
    *(double *)tmp = *p;
    *p = dVar1;
  }
  return;
}

Assistant:

static void ON_QSORT_SHORT_SORT_FNAME(ON_SORT_TEMPLATE_TYPE *lo, ON_SORT_TEMPLATE_TYPE *hi)
{
  ON_SORT_TEMPLATE_TYPE *p;
  ON_SORT_TEMPLATE_TYPE *max;
  ON_SORT_TEMPLATE_TYPE tmp;

  /* Note: in assertions below, i and j are always inside original bound of
      array to sort. */

  while (hi > lo)
  {
    /* A[i] <= A[j] for i <= j, j > hi */
    max = lo;
    for (p = lo+1; p <= hi; p++)
    {
      /* A[i] <= A[max] for lo <= i < p */
      if ( ON_QSORT_GT(p,max) )
      {
          max = p;
      }
      /* A[i] <= A[max] for lo <= i <= p */
    }

    /* A[i] <= A[max] for lo <= i <= hi */

    ON_QSORT_SWAP(max,hi);

    /* A[i] <= A[hi] for i <= hi, so A[i] <= A[j] for i <= j, j >= hi */

    hi--;

    /* A[i] <= A[j] for i <= j, j > hi, loop top condition established */
  }
  /* A[i] <= A[j] for i <= j, j > lo, which implies A[i] <= A[j] for i < j,
      so array is sorted */
}